

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

bool CSOAA::ec_is_label_definition(example *ec)

{
  uchar *puVar1;
  wclass *pwVar2;
  long lVar3;
  ulong uVar4;
  uint32_t *puVar5;
  ulong uVar6;
  
  puVar1 = (ec->super_example_predict).indices._begin;
  if (((ec->super_example_predict).indices._end != puVar1) && (*puVar1 == 'l')) {
    pwVar2 = (ec->l).cs.costs._begin;
    lVar3 = (long)(ec->l).cs.costs._end - (long)pwVar2;
    if (lVar3 == 0) {
      return true;
    }
    uVar4 = lVar3 >> 4;
    puVar5 = &pwVar2->class_index;
    uVar6 = 0;
    while ((*puVar5 == 0 && (0.0 < ((wclass *)(puVar5 + -1))->x))) {
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 4;
      if (uVar4 + (uVar4 == 0) == uVar6) {
        return uVar4 <= uVar6;
      }
    }
  }
  return false;
}

Assistant:

inline size_t size() const { return _end - _begin; }